

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *pcVar1;
  Property *this_00;
  bool bVar2;
  cmCompiledGeneratorExpression *pcVar3;
  string *psVar4;
  PropertyMapType *this_01;
  ostream *poVar5;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string value;
  value_type *j;
  const_iterator __end2;
  const_iterator __begin2;
  ExpressionVectorType *__range2;
  string local_c0;
  int local_9c;
  Property *local_98;
  Property *property;
  string *name;
  value_type *i;
  const_iterator __end1;
  const_iterator __begin1;
  PropertyMapType *__range1;
  PropertyMapType *properties;
  string local_50;
  string *local_30;
  string *expandedFileName;
  string *config_local;
  ostream *os_local;
  cmCPackPropertiesGenerator *this_local;
  Indent indent_local;
  
  expandedFileName = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  pcVar3 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  psVar4 = expandedFileName;
  pcVar1 = this->LG;
  std::__cxx11::string::string((string *)&local_50);
  psVar4 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar3,pcVar1,psVar4,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = psVar4;
  this_01 = cmInstalledFile::GetProperties_abi_cxx11_(this->InstalledFile);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
           ::begin(this_01);
  i = (value_type *)
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
      ::end(this_01);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar2) break;
    property = (Property *)
               std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
               ::operator*(&__end1);
    local_98 = &((reference)property)->second;
    local_9c = this_local._4_4_;
    name = (string *)property;
    poVar5 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar5 = std::operator<<(poVar5,"set_property(INSTALL ");
    cmOutputConverter::EscapeForCMake(&local_c0,local_30);
    poVar5 = std::operator<<(poVar5,(string *)&local_c0);
    poVar5 = std::operator<<(poVar5," PROPERTY ");
    cmOutputConverter::EscapeForCMake((string *)&__range2,(string *)property);
    std::operator<<(poVar5,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_c0);
    this_00 = local_98;
    __end2 = std::
             vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
             ::begin(&local_98->ValueExpressions);
    j = (value_type *)
        std::
        vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
        end(&this_00->ValueExpressions);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
                                  *)&j);
      if (!bVar2) break;
      value.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
           ::operator*(&__end2);
      psVar4 = expandedFileName;
      pcVar3 = *(cmCompiledGeneratorExpression **)value.field_2._8_8_;
      pcVar1 = this->LG;
      std::__cxx11::string::string((string *)&local_140);
      psVar4 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar3,pcVar1,psVar4,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_140
                         );
      std::__cxx11::string::string((string *)local_120,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_140);
      poVar5 = std::operator<<((ostream *)config_local," ");
      cmOutputConverter::EscapeForCMake(&local_160,(string *)local_120);
      std::operator<<(poVar5,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)local_120);
      __gnu_cxx::
      __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)config_local,")\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}